

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

char * CVmObjList::list_to_string(vm_val_t *retval,vm_val_t *self,int radix,int flags)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  anon_union_8_8_cb74652f_for_val aVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vm_val_t *pvVar34;
  vm_val_t *pvVar35;
  uint uVar36;
  char *pcVar37;
  ushort *puVar38;
  long lVar39;
  ulong uVar40;
  uint uVar41;
  undefined1 auVar42 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar62;
  int iVar65;
  int iVar66;
  undefined1 auVar63 [16];
  int iVar67;
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar81;
  int iVar85;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vm_val_t newlstval;
  vm_val_t newele;
  vm_val_t ele;
  vm_val_t local_60;
  vm_val_t local_50;
  vm_val_t local_40;
  
  uVar36 = vm_val_t::ll_length(self);
  local_60.val.obj = create(0,(long)(int)uVar36);
  local_60.typ = VM_OBJ;
  uVar41 = local_60.val.obj >> 0xc;
  lVar25 = (ulong)((local_60.val.obj & 0xfff) << 3) * 3;
  (**(code **)(*(long *)((long)&G_obj_table_X.pages_[uVar41]->ptr_ + lVar25) + 8))
            ((long)&G_obj_table_X.pages_[uVar41]->ptr_ + lVar25,metaclass_reg_);
  auVar33 = _DAT_002fd350;
  auVar32 = _DAT_002fd340;
  auVar31 = _DAT_002c63f0;
  auVar30 = _DAT_002c63e0;
  auVar29 = _DAT_002c4b80;
  auVar28 = _DAT_002c4b70;
  auVar27 = _DAT_002c4b60;
  auVar43._8_8_ = extraout_XMM1_Qb;
  auVar43._0_8_ = extraout_XMM1_Qa;
  pCVar2 = G_obj_table_X.pages_[uVar41];
  puVar38 = *(ushort **)((long)&pCVar2->ptr_ + lVar25 + 8);
  uVar1 = *puVar38;
  if ((ulong)uVar1 != 0) {
    puVar38 = puVar38 + 1;
    lVar39 = (ulong)uVar1 - 1;
    auVar42._8_4_ = (int)lVar39;
    auVar42._0_8_ = lVar39;
    auVar42._12_4_ = (int)((ulong)lVar39 >> 0x20);
    uVar40 = 0;
    do {
      auVar60._8_4_ = (int)uVar40;
      auVar60._0_8_ = uVar40;
      auVar60._12_4_ = (int)(uVar40 >> 0x20);
      auVar63 = auVar42 ^ auVar29;
      auVar68 = (auVar60 | auVar28) ^ auVar29;
      iVar62 = auVar63._0_4_;
      iVar81 = -(uint)(iVar62 < auVar68._0_4_);
      iVar65 = auVar63._4_4_;
      auVar70._4_4_ = -(uint)(iVar65 < auVar68._4_4_);
      iVar66 = auVar63._8_4_;
      iVar85 = -(uint)(iVar66 < auVar68._8_4_);
      iVar67 = auVar63._12_4_;
      auVar70._12_4_ = -(uint)(iVar67 < auVar68._12_4_);
      auVar44._4_4_ = iVar81;
      auVar44._0_4_ = iVar81;
      auVar44._8_4_ = iVar85;
      auVar44._12_4_ = iVar85;
      auVar43 = pshuflw(auVar43,auVar44,0xe8);
      auVar69._4_4_ = -(uint)(auVar68._4_4_ == iVar65);
      auVar69._12_4_ = -(uint)(auVar68._12_4_ == iVar67);
      auVar69._0_4_ = auVar69._4_4_;
      auVar69._8_4_ = auVar69._12_4_;
      auVar68 = pshuflw(in_XMM2,auVar69,0xe8);
      auVar70._0_4_ = auVar70._4_4_;
      auVar70._8_4_ = auVar70._12_4_;
      auVar44 = pshuflw(auVar43,auVar70,0xe8);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar63 = (auVar44 | auVar68 & auVar43) ^ auVar63;
      auVar43 = packssdw(auVar63,auVar63);
      if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)puVar38 = 1;
      }
      auVar12._4_4_ = iVar81;
      auVar12._0_4_ = iVar81;
      auVar12._8_4_ = iVar85;
      auVar12._12_4_ = iVar85;
      auVar70 = auVar69 & auVar12 | auVar70;
      auVar43 = packssdw(auVar70,auVar70);
      auVar68._8_4_ = 0xffffffff;
      auVar68._0_8_ = 0xffffffffffffffff;
      auVar68._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar68,auVar43 ^ auVar68);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 5) = 1;
      }
      auVar43 = (auVar60 | auVar27) ^ auVar29;
      auVar53._0_4_ = -(uint)(iVar62 < auVar43._0_4_);
      auVar53._4_4_ = -(uint)(iVar65 < auVar43._4_4_);
      auVar53._8_4_ = -(uint)(iVar66 < auVar43._8_4_);
      auVar53._12_4_ = -(uint)(iVar67 < auVar43._12_4_);
      auVar71._4_4_ = auVar53._0_4_;
      auVar71._0_4_ = auVar53._0_4_;
      auVar71._8_4_ = auVar53._8_4_;
      auVar71._12_4_ = auVar53._8_4_;
      iVar81 = -(uint)(auVar43._4_4_ == iVar65);
      iVar85 = -(uint)(auVar43._12_4_ == iVar67);
      auVar13._4_4_ = iVar81;
      auVar13._0_4_ = iVar81;
      auVar13._8_4_ = iVar85;
      auVar13._12_4_ = iVar85;
      auVar82._4_4_ = auVar53._4_4_;
      auVar82._0_4_ = auVar53._4_4_;
      auVar82._8_4_ = auVar53._12_4_;
      auVar82._12_4_ = auVar53._12_4_;
      auVar43 = auVar13 & auVar71 | auVar82;
      auVar43 = packssdw(auVar43,auVar43);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar3,auVar43 ^ auVar3);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)(puVar38 + 5) = 1;
      }
      auVar43 = pshufhw(auVar43,auVar71,0x84);
      auVar14._4_4_ = iVar81;
      auVar14._0_4_ = iVar81;
      auVar14._8_4_ = iVar85;
      auVar14._12_4_ = iVar85;
      auVar44 = pshufhw(auVar53,auVar14,0x84);
      auVar63 = pshufhw(auVar43,auVar82,0x84);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar63 | auVar44 & auVar43) ^ auVar45;
      auVar43 = packssdw(auVar45,auVar45);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 0xf) = 1;
      }
      auVar43 = (auVar60 | auVar31) ^ auVar29;
      auVar54._0_4_ = -(uint)(iVar62 < auVar43._0_4_);
      auVar54._4_4_ = -(uint)(iVar65 < auVar43._4_4_);
      auVar54._8_4_ = -(uint)(iVar66 < auVar43._8_4_);
      auVar54._12_4_ = -(uint)(iVar67 < auVar43._12_4_);
      auVar15._4_4_ = auVar54._0_4_;
      auVar15._0_4_ = auVar54._0_4_;
      auVar15._8_4_ = auVar54._8_4_;
      auVar15._12_4_ = auVar54._8_4_;
      auVar44 = pshuflw(auVar82,auVar15,0xe8);
      auVar46._0_4_ = -(uint)(auVar43._0_4_ == iVar62);
      auVar46._4_4_ = -(uint)(auVar43._4_4_ == iVar65);
      auVar46._8_4_ = -(uint)(auVar43._8_4_ == iVar66);
      auVar46._12_4_ = -(uint)(auVar43._12_4_ == iVar67);
      auVar72._4_4_ = auVar46._4_4_;
      auVar72._0_4_ = auVar46._4_4_;
      auVar72._8_4_ = auVar46._12_4_;
      auVar72._12_4_ = auVar46._12_4_;
      auVar43 = pshuflw(auVar46,auVar72,0xe8);
      auVar73._4_4_ = auVar54._4_4_;
      auVar73._0_4_ = auVar54._4_4_;
      auVar73._8_4_ = auVar54._12_4_;
      auVar73._12_4_ = auVar54._12_4_;
      auVar63 = pshuflw(auVar54,auVar73,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 & auVar44,(auVar63 | auVar43 & auVar44) ^ auVar4);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar38 + 10) = 1;
      }
      auVar16._4_4_ = auVar54._0_4_;
      auVar16._0_4_ = auVar54._0_4_;
      auVar16._8_4_ = auVar54._8_4_;
      auVar16._12_4_ = auVar54._8_4_;
      auVar73 = auVar72 & auVar16 | auVar73;
      auVar63 = packssdw(auVar73,auVar73);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43,auVar63 ^ auVar5);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 0x19) = 1;
      }
      auVar43 = (auVar60 | auVar30) ^ auVar29;
      auVar55._0_4_ = -(uint)(iVar62 < auVar43._0_4_);
      auVar55._4_4_ = -(uint)(iVar65 < auVar43._4_4_);
      auVar55._8_4_ = -(uint)(iVar66 < auVar43._8_4_);
      auVar55._12_4_ = -(uint)(iVar67 < auVar43._12_4_);
      auVar74._4_4_ = auVar55._0_4_;
      auVar74._0_4_ = auVar55._0_4_;
      auVar74._8_4_ = auVar55._8_4_;
      auVar74._12_4_ = auVar55._8_4_;
      iVar81 = -(uint)(auVar43._4_4_ == iVar65);
      iVar85 = -(uint)(auVar43._12_4_ == iVar67);
      auVar17._4_4_ = iVar81;
      auVar17._0_4_ = iVar81;
      auVar17._8_4_ = iVar85;
      auVar17._12_4_ = iVar85;
      auVar83._4_4_ = auVar55._4_4_;
      auVar83._0_4_ = auVar55._4_4_;
      auVar83._8_4_ = auVar55._12_4_;
      auVar83._12_4_ = auVar55._12_4_;
      auVar43 = auVar17 & auVar74 | auVar83;
      auVar43 = packssdw(auVar43,auVar43);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar6,auVar43 ^ auVar6);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar38 + 0xf) = 1;
      }
      auVar43 = pshufhw(auVar43,auVar74,0x84);
      auVar18._4_4_ = iVar81;
      auVar18._0_4_ = iVar81;
      auVar18._8_4_ = iVar85;
      auVar18._12_4_ = iVar85;
      auVar44 = pshufhw(auVar55,auVar18,0x84);
      auVar63 = pshufhw(auVar43,auVar83,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar63 | auVar44 & auVar43) ^ auVar47;
      auVar43 = packssdw(auVar47,auVar47);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 0x23) = 1;
      }
      auVar43 = (auVar60 | auVar33) ^ auVar29;
      auVar56._0_4_ = -(uint)(iVar62 < auVar43._0_4_);
      auVar56._4_4_ = -(uint)(iVar65 < auVar43._4_4_);
      auVar56._8_4_ = -(uint)(iVar66 < auVar43._8_4_);
      auVar56._12_4_ = -(uint)(iVar67 < auVar43._12_4_);
      auVar19._4_4_ = auVar56._0_4_;
      auVar19._0_4_ = auVar56._0_4_;
      auVar19._8_4_ = auVar56._8_4_;
      auVar19._12_4_ = auVar56._8_4_;
      auVar44 = pshuflw(auVar83,auVar19,0xe8);
      auVar48._0_4_ = -(uint)(auVar43._0_4_ == iVar62);
      auVar48._4_4_ = -(uint)(auVar43._4_4_ == iVar65);
      auVar48._8_4_ = -(uint)(auVar43._8_4_ == iVar66);
      auVar48._12_4_ = -(uint)(auVar43._12_4_ == iVar67);
      auVar75._4_4_ = auVar48._4_4_;
      auVar75._0_4_ = auVar48._4_4_;
      auVar75._8_4_ = auVar48._12_4_;
      auVar75._12_4_ = auVar48._12_4_;
      auVar43 = pshuflw(auVar48,auVar75,0xe8);
      auVar76._4_4_ = auVar56._4_4_;
      auVar76._0_4_ = auVar56._4_4_;
      auVar76._8_4_ = auVar56._12_4_;
      auVar76._12_4_ = auVar56._12_4_;
      auVar63 = pshuflw(auVar56,auVar76,0xe8);
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar57 = (auVar63 | auVar43 & auVar44) ^ auVar57;
      auVar63 = packssdw(auVar57,auVar57);
      auVar43 = packsswb(auVar43 & auVar44,auVar63);
      if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar38 + 0x14) = 1;
      }
      auVar20._4_4_ = auVar56._0_4_;
      auVar20._0_4_ = auVar56._0_4_;
      auVar20._8_4_ = auVar56._8_4_;
      auVar20._12_4_ = auVar56._8_4_;
      auVar76 = auVar75 & auVar20 | auVar76;
      auVar63 = packssdw(auVar76,auVar76);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar63 = packssdw(auVar63 ^ auVar7,auVar63 ^ auVar7);
      auVar43 = packsswb(auVar43,auVar63);
      if ((auVar43._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 0x2d) = 1;
      }
      auVar43 = (auVar60 | auVar32) ^ auVar29;
      auVar58._0_4_ = -(uint)(iVar62 < auVar43._0_4_);
      auVar58._4_4_ = -(uint)(iVar65 < auVar43._4_4_);
      auVar58._8_4_ = -(uint)(iVar66 < auVar43._8_4_);
      auVar58._12_4_ = -(uint)(iVar67 < auVar43._12_4_);
      auVar77._4_4_ = auVar58._0_4_;
      auVar77._0_4_ = auVar58._0_4_;
      auVar77._8_4_ = auVar58._8_4_;
      auVar77._12_4_ = auVar58._8_4_;
      iVar81 = -(uint)(auVar43._4_4_ == iVar65);
      iVar85 = -(uint)(auVar43._12_4_ == iVar67);
      auVar21._4_4_ = iVar81;
      auVar21._0_4_ = iVar81;
      auVar21._8_4_ = iVar85;
      auVar21._12_4_ = iVar85;
      auVar84._4_4_ = auVar58._4_4_;
      auVar84._0_4_ = auVar58._4_4_;
      auVar84._8_4_ = auVar58._12_4_;
      auVar84._12_4_ = auVar58._12_4_;
      auVar43 = auVar21 & auVar77 | auVar84;
      auVar43 = packssdw(auVar43,auVar43);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar8,auVar43 ^ auVar8);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar38 + 0x19) = 1;
      }
      auVar43 = pshufhw(auVar43,auVar77,0x84);
      auVar22._4_4_ = iVar81;
      auVar22._0_4_ = iVar81;
      auVar22._8_4_ = iVar85;
      auVar22._12_4_ = iVar85;
      auVar44 = pshufhw(auVar58,auVar22,0x84);
      auVar63 = pshufhw(auVar43,auVar84,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar63 | auVar44 & auVar43) ^ auVar49;
      auVar43 = packssdw(auVar49,auVar49);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 0x37) = 1;
      }
      auVar43 = (auVar60 | _DAT_002fd330) ^ auVar29;
      auVar59._0_4_ = -(uint)(iVar62 < auVar43._0_4_);
      auVar59._4_4_ = -(uint)(iVar65 < auVar43._4_4_);
      auVar59._8_4_ = -(uint)(iVar66 < auVar43._8_4_);
      auVar59._12_4_ = -(uint)(iVar67 < auVar43._12_4_);
      auVar23._4_4_ = auVar59._0_4_;
      auVar23._0_4_ = auVar59._0_4_;
      auVar23._8_4_ = auVar59._8_4_;
      auVar23._12_4_ = auVar59._8_4_;
      auVar44 = pshuflw(auVar84,auVar23,0xe8);
      auVar50._0_4_ = -(uint)(auVar43._0_4_ == iVar62);
      auVar50._4_4_ = -(uint)(auVar43._4_4_ == iVar65);
      auVar50._8_4_ = -(uint)(auVar43._8_4_ == iVar66);
      auVar50._12_4_ = -(uint)(auVar43._12_4_ == iVar67);
      auVar78._4_4_ = auVar50._4_4_;
      auVar78._0_4_ = auVar50._4_4_;
      auVar78._8_4_ = auVar50._12_4_;
      auVar78._12_4_ = auVar50._12_4_;
      auVar43 = pshuflw(auVar50,auVar78,0xe8);
      auVar79._4_4_ = auVar59._4_4_;
      auVar79._0_4_ = auVar59._4_4_;
      auVar79._8_4_ = auVar59._12_4_;
      auVar79._12_4_ = auVar59._12_4_;
      auVar63 = pshuflw(auVar59,auVar79,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 & auVar44,(auVar63 | auVar43 & auVar44) ^ auVar9);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar38 + 0x1e) = 1;
      }
      auVar24._4_4_ = auVar59._0_4_;
      auVar24._0_4_ = auVar59._0_4_;
      auVar24._8_4_ = auVar59._8_4_;
      auVar24._12_4_ = auVar59._8_4_;
      auVar79 = auVar78 & auVar24 | auVar79;
      auVar63 = packssdw(auVar79,auVar79);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43,auVar63 ^ auVar10);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 0x41) = 1;
      }
      auVar43 = (auVar60 | _DAT_002fd320) ^ auVar29;
      auVar51._0_4_ = -(uint)(iVar62 < auVar43._0_4_);
      auVar51._4_4_ = -(uint)(iVar65 < auVar43._4_4_);
      auVar51._8_4_ = -(uint)(iVar66 < auVar43._8_4_);
      auVar51._12_4_ = -(uint)(iVar67 < auVar43._12_4_);
      auVar80._4_4_ = auVar51._0_4_;
      auVar80._0_4_ = auVar51._0_4_;
      auVar80._8_4_ = auVar51._8_4_;
      auVar80._12_4_ = auVar51._8_4_;
      auVar61._4_4_ = -(uint)(auVar43._4_4_ == iVar65);
      auVar61._12_4_ = -(uint)(auVar43._12_4_ == iVar67);
      auVar61._0_4_ = auVar61._4_4_;
      auVar61._8_4_ = auVar61._12_4_;
      auVar64._4_4_ = auVar51._4_4_;
      auVar64._0_4_ = auVar51._4_4_;
      auVar64._8_4_ = auVar51._12_4_;
      auVar64._12_4_ = auVar51._12_4_;
      auVar63 = auVar61 & auVar80 | auVar64;
      auVar43 = packssdw(auVar51,auVar63);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar43 = packssdw(auVar43 ^ auVar11,auVar43 ^ auVar11);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar38 + 0x23) = 1;
      }
      auVar43 = pshufhw(auVar43,auVar80,0x84);
      in_XMM2 = pshufhw(auVar63,auVar61,0x84);
      in_XMM2 = in_XMM2 & auVar43;
      auVar43 = pshufhw(auVar43,auVar64,0x84);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar52 = (auVar43 | in_XMM2) ^ auVar52;
      auVar43 = packssdw(auVar52,auVar52);
      auVar43 = packsswb(auVar43,auVar43);
      if ((auVar43._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar38 + 0x4b) = 1;
      }
      uVar40 = uVar40 + 0x10;
      puVar38 = puVar38 + 0x28;
    } while ((uVar1 + 0xf & 0xfffffff0) != uVar40);
  }
  pvVar34 = sp_;
  aVar26._4_4_ = local_60.val._4_4_;
  aVar26.obj = local_60.val.obj;
  pvVar35 = sp_ + 1;
  *(ulong *)sp_ = CONCAT44(local_60._4_4_,local_60.typ);
  sp_ = pvVar35;
  pvVar34->val = aVar26;
  if (0 < (int)uVar36) {
    lVar39 = 2;
    uVar40 = 0;
    do {
      uVar40 = uVar40 + 1;
      local_50.typ = VM_INT;
      local_50.val.obj = (vm_obj_id_t)uVar40;
      vm_val_t::ll_index(self,&local_40,&local_50);
      CVmBifTADS::toString(&local_50,&local_40,radix,flags);
      vmb_put_dh((char *)(*(long *)((long)&pCVar2->ptr_ + lVar25 + 8) + lVar39),&local_50);
      lVar39 = lVar39 + 5;
    } while (uVar36 != uVar40);
  }
  join(retval,&local_60,",",1);
  sp_ = sp_ + -1;
  pcVar37 = vm_val_t::get_as_string(retval);
  return pcVar37;
}

Assistant:

const char *CVmObjList::list_to_string(
    VMG_ vm_val_t *retval, const vm_val_t *self, int radix, int flags)
{
    /* count our elements */
    int n = self->ll_length(vmg0_);

    /* create a list with the same number of elements */
    vm_val_t newlstval;
    newlstval.set_obj(create(vmg_ FALSE, n));
    CVmObjList *newlst = vm_objid_cast(CVmObjList, newlstval.val.obj);
    newlst->cons_clear();

    /* push the new list for gc protection */
    G_stk->push(&newlstval);

    /* set up the new list as self.mapAll({x: toString(x)}) */
    for (int i = 0 ; i < n ; ++i)
    {
        /* get this element of the old list */
        vm_val_t ele;
        self->ll_index(vmg_ &ele, i+1);

        /* convert it to a string */
        vm_val_t newele;
        CVmBifTADS::toString(vmg_ &newele, &ele, radix, flags);

        /* store the result in the new list */
        newlst->cons_set_element(i, &newele);
    }

    /* convert the new list to a string using the basic join with commas */
    join(vmg_ retval, &newlstval, ",", 1);

    /* discard gc protection */
    G_stk->discard(1);

    /* return the new string */
    return retval->get_as_string(vmg0_);
}


/* ------------------------------------------------------------------------ */
/*
 *   Property evaluator - generate (static property)
 */
int CVmObjList::static_getp_generate(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the callback function argument */
    vm_val_t *func = G_stk->get(0);

    /* make sure it's a function; set up a header pointer if it is */
    CVmFuncPtr funcdesc;
    if (!funcdesc.set(vmg_ func))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the count */
    int32_t cnt = G_stk->get(1)->num_to_int(vmg0_);

    /* make sure it's not negative */
    if (cnt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* push the list value for gc protection */
    G_stk->push(retval);

    /* zero the element count, so that the gc doesn't deref garbage */
    lst->cons_set_len(0);

    /* find out how many arguments the function wants */
    int fargc = funcdesc.is_varargs() ? -1 : funcdesc.get_max_argc();

    /* set up our recursive call descriptor */
    vm_rcdesc rc(vmg_ "List.generate",
                 CVmObjList::metaclass_reg_->get_class_obj(vmg0_),
                 PROPIDX_generate, func, argc);

    /* generate the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* push the callback arguments */
        const int pushed_argc = 1;
        G_stk->push()->set_int(i+1);

        /* adjust the arguments for what the callback actually wants */
        int sent_argc = fargc < 0 || fargc > pushed_argc ? pushed_argc : fargc;

        /* call the callback */
        G_interpreter->call_func_ptr(vmg_ func, sent_argc, &rc, 0);

        /* discard excess arguments */
        G_stk->discard(pushed_argc - sent_argc);

        /* add the result to the list */
        lst->cons_set_len(i+1);
        lst->cons_set_element(i, G_interpreter->get_r0());
    }

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}

/* ------------------------------------------------------------------------ */
/*
 *   Property evaluator: get the index of the element with the minimum value 
 */
int CVmObjList::getp_indexOfMin(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *in_argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "List.indexOfMin", self_val, 29, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, -1, TRUE);
}

/*
 *   Property evaluator: get the value of the element with the minimum value 
 */
int CVmObjList::getp_minVal(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* do the general calculation to select the minimum value ("-1") */
    vm_rcdesc rc(vmg_ "List.minVal", self_val, 30, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, -1, FALSE);
}

/*
 *   Property evaluator: get the index of the element with the maximum value 
 */
int CVmObjList::getp_indexOfMax(VMG_ vm_val_t *retval,
                                const vm_val_t *self_val,
                                const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.indexOfMax", self_val, 31, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, TRUE);
}

/*
 *   Property evaluator: get the value of the element with the maximum value 
 */
int CVmObjList::getp_maxVal(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* do the general calculation to select the maximum value ("+1") */
    vm_rcdesc rc(vmg_ "List.maxVal", self_val, 32, G_stk->get(0),
                 in_argc != 0 ? *in_argc : 0);
    return get_minmax(vmg_ retval, self_val, lst, in_argc, &rc, 1, FALSE);
}

/*
 *   General handling for minIndex, minVal, maxIndex, and maxVal.  This finds
 *   the highest/lowest value in the list, optionally mapped through a
 *   callback function.  Returns the winning element's index and value.
 *   
 *   'sense' is the sense of the search: -1 for minimum, 1 for maximum.
 *   'want_index' is true if 'retval' should be set to the index of the
 *   winning element, false if 'retval' should be set to the winning
 *   element's value.  
 */
int CVmObjList::get_minmax(VMG_ vm_val_t *retval,
                           const vm_val_t *self_val,
                           const char *lst, uint *in_argc,
                           const vm_rcdesc *rc, int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* if there are no elements, this is an error */
    int cnt = vmb_get_len(lst);
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element_const(lst, i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);
    
    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}



/* ------------------------------------------------------------------------ */
/*
 *   Constant-pool list object 
 */

/*
 *   create 
 */
vm_obj_id_t CVmObjListConst::create(VMG_ const char *const_ptr)
{
    /* create our new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create our list object, pointing directly to the constant pool */
    new (vmg_ id) CVmObjListConst(vmg_ const_ptr);

    /* return the new ID */
    return id;
}